

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void convert_2u32s_C1R(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  OPJ_UINT32 val_1;
  OPJ_UINT32 val;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val_1 = 0; _val_1 < (length & 0xfffffffffffffffc); _val_1 = _val_1 + 4) {
    bVar1 = (byte)*pDst_local;
    pDst[_val_1] = (uint)(bVar1 >> 6);
    pDst[_val_1 + 1] = bVar1 >> 4 & 3;
    pDst[_val_1 + 2] = bVar1 >> 2 & 3;
    pDst[_val_1 + 3] = bVar1 & 3;
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
  }
  if ((length & 3) != 0) {
    bVar1 = (byte)*pDst_local;
    pDst[_val_1] = (uint)(bVar1 >> 6);
    if ((1 < (length & 3)) && (pDst[_val_1 + 1] = bVar1 >> 4 & 3, 2 < (length & 3))) {
      pDst[_val_1 + 2] = bVar1 >> 2 & 3;
    }
  }
  return;
}

Assistant:

static void convert_2u32s_C1R(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)3U); i+=4U) {
		OPJ_UINT32 val = *pSrc++;
		pDst[i+0] = (OPJ_INT32)( val >> 6);
		pDst[i+1] = (OPJ_INT32)((val >> 4) & 0x3U);
		pDst[i+2] = (OPJ_INT32)((val >> 2) & 0x3U);
		pDst[i+3] = (OPJ_INT32)(val & 0x3U);
	}
	if (length & 3U) {
		OPJ_UINT32 val = *pSrc++;
		length = length & 3U;
		pDst[i+0] =  (OPJ_INT32)(val >> 6);
		
		if (length > 1U) {
			pDst[i+1] = (OPJ_INT32)((val >> 4) & 0x3U);
			if (length > 2U) {
				pDst[i+2] = (OPJ_INT32)((val >> 2) & 0x3U);
				
			}
		}
	}
}